

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<F3DFloor_*,_F3DFloor_*>::~TDeletingArray
          (TDeletingArray<F3DFloor_*,_F3DFloor_*> *this)

{
  uint uVar1;
  F3DFloor **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<F3DFloor_*,_F3DFloor_*>::Size(&this->super_TArray<F3DFloor_*,_F3DFloor_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppFVar2 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                        (&this->super_TArray<F3DFloor_*,_F3DFloor_*>,(ulong)local_14);
    if (*ppFVar2 != (F3DFloor *)0x0) {
      ppFVar2 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          (&this->super_TArray<F3DFloor_*,_F3DFloor_*>,(ulong)local_14);
      if (*ppFVar2 != (F3DFloor *)0x0) {
        operator_delete(*ppFVar2,0x98);
      }
    }
  }
  TArray<F3DFloor_*,_F3DFloor_*>::~TArray(&this->super_TArray<F3DFloor_*,_F3DFloor_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}